

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O3

Abc_Obj_t * Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *pOrigObj)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  uint uVar6;
  int iVar7;
  Abc_Obj_t *pObj;
  NodeLag_t *pNVar8;
  int *__s;
  Abc_Obj_t *pAVar9;
  MinRegMan_t *pMVar10;
  int Fill;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong uVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  
  if (pOrigObj == (Abc_Obj_t *)0x0) {
    __assert_fail("pOrigObj",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretInit.c"
                  ,0x343,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
  }
  uVar6 = *(uint *)&pOrigObj->field_0x14;
  if ((uVar6 & 0xf) == 3) {
    __assert_fail("!Abc_ObjIsPo(pOrigObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretInit.c"
                  ,0x347,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
  }
  if ((uVar6 & 0xf) == 2) {
    __assert_fail("!Abc_ObjIsPi(pOrigObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretInit.c"
                  ,0x346,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
  }
  if ((pManMR->pDataArray[(uint)pOrigObj->Id].field_0x1 & 1) == 0) {
    if ((uVar6 & 0x10) == 0) {
      pObj = Abc_FlowRetime_CopyNodeToInitNtk(pOrigObj);
      pMVar10 = pManMR;
      iVar2 = pObj->Id;
      iVar12 = pManMR->sizeInitToOrig;
      if (iVar2 < iVar12) {
        pNVar8 = pManMR->pInitToOrig;
        uVar11 = extraout_RDX;
      }
      else {
        iVar7 = (int)((double)iVar2 * 1.5 + 10.0);
        pManMR->sizeInitToOrig = iVar7;
        pNVar8 = (NodeLag_t *)realloc(pMVar10->pInitToOrig,(long)iVar7 << 3);
        pMVar10 = pManMR;
        pManMR->pInitToOrig = pNVar8;
        memset(pNVar8 + iVar12,0,((long)pMVar10->sizeInitToOrig - (long)iVar12) * 8);
        uVar11 = extraout_RDX_00;
      }
      if (pNVar8 == (NodeLag_t *)0x0) {
        __assert_fail("pManMR->pInitToOrig",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretInit.c"
                      ,0x511,"void Abc_FlowRetime_SetInitToOrig(Abc_Obj_t *, Abc_Obj_t *)");
      }
      uVar6 = *(uint *)&pOrigObj->field_0x14 & 0xf;
      if ((uVar6 < 9) && ((0x130U >> uVar6 & 1) != 0)) {
        Abc_FlowRetime_ClearInitToOrig((Abc_Obj_t *)(ulong)(uint)pObj->Id);
        pMVar10 = pManMR;
      }
      else {
        pAVar4 = pOrigObj->pNtk;
        if ((pAVar4->vTravIds).pArray == (int *)0x0) {
          iVar12 = pAVar4->vObjs->nSize;
          uVar1 = (long)iVar12 + 500;
          iVar7 = (int)uVar1;
          if ((pAVar4->vTravIds).nCap < iVar7) {
            __s = (int *)malloc(uVar1 * 4);
            (pAVar4->vTravIds).pArray = __s;
            if (__s == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            (pAVar4->vTravIds).nCap = iVar7;
            uVar11 = extraout_RDX_01;
          }
          else {
            __s = (int *)0x0;
          }
          if (-500 < iVar12) {
            memset(__s,0,(uVar1 & 0xffffffff) << 2);
            uVar11 = extraout_RDX_02;
          }
          (pAVar4->vTravIds).nSize = iVar7;
        }
        iVar12 = pAVar4->nTravIds;
        pAVar4->nTravIds = iVar12 + 1;
        if (0x3ffffffe < iVar12) {
          __assert_fail("p->nTravIds < (1<<30)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                        ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
        }
        uVar6 = *(uint *)&pOrigObj->field_0x14;
        iVar12 = 0;
        pAVar9 = pOrigObj;
        while( true ) {
          if ((8 < (uVar6 & 0xf)) || ((0x130U >> (uVar6 & 0xf) & 1) == 0)) goto LAB_0048037b;
          if ((pAVar9->vFanins).nSize == 0) {
            __assert_fail("Abc_ObjFaninNum(*pResult)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretInit.c"
                          ,0x6b,"int Abc_FlowRetime_ObjFirstNonLatchBox(Abc_Obj_t *, Abc_Obj_t **)")
            ;
          }
          pAVar9 = (Abc_Obj_t *)pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanins).pArray];
          pAVar4 = pAVar9->pNtk;
          iVar7 = pAVar9->Id;
          Vec_IntFillExtra(&pAVar4->vTravIds,iVar7 + 1,(int)uVar11);
          if (((long)iVar7 < 0) || ((pAVar4->vTravIds).nSize <= iVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pAVar5 = pAVar9->pNtk;
          iVar3 = pAVar5->nTravIds;
          if ((pAVar4->vTravIds).pArray[iVar7] == iVar3) break;
          iVar7 = pAVar9->Id;
          Vec_IntFillExtra(&pAVar5->vTravIds,iVar7 + 1,Fill);
          if (((long)iVar7 < 0) || ((pAVar5->vTravIds).nSize <= iVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (pAVar5->vTravIds).pArray[iVar7] = iVar3;
          uVar6 = *(uint *)&pAVar9->field_0x14;
          bVar14 = (uVar6 & 0xf) == 8;
          uVar11 = (ulong)bVar14;
          iVar12 = iVar12 + (uint)bVar14;
        }
        iVar12 = -1;
LAB_0048037b:
        pManMR->pInitToOrig[iVar2].id = pAVar9->Id;
        iVar7 = Abc_FlowRetime_GetLag(pAVar9);
        pMVar10 = pManMR;
        pManMR->pInitToOrig[iVar2].lag = iVar7 + iVar12;
      }
      pMVar10->pDataArray[(uint)pOrigObj->Id].field_1.pred = pObj;
      uVar6 = *(uint *)&pOrigObj->field_0x14 | 0x10;
      *(uint *)&pOrigObj->field_0x14 = uVar6;
    }
    else {
      pObj = pManMR->pDataArray[(uint)pOrigObj->Id].field_1.pred;
    }
    if (pObj == (Abc_Obj_t *)0x0) {
      __assert_fail("pInitObj",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretInit.c"
                    ,0x359,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
    }
    if ((uVar6 & 0x20) == 0) {
      if (0 < (pOrigObj->vFanins).nSize) {
        lVar13 = 0;
        do {
          pAVar9 = (Abc_Obj_t *)pOrigObj->pNtk->vObjs->pArray[(pOrigObj->vFanins).pArray[lVar13]];
          if ((*(uint *)&pAVar9->field_0x14 & 0xf) == 5) {
            __assert_fail("!Abc_ObjIsBo( pOrigFanin )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretInit.c"
                          ,0x362,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
          }
          pAVar9 = Abc_FlowRetime_UpdateBackwardInit_rec(pAVar9);
          Abc_ObjAddFanin(pObj,pAVar9);
          lVar13 = lVar13 + 1;
        } while (lVar13 < (pOrigObj->vFanins).nSize);
        uVar6 = *(uint *)&pOrigObj->field_0x14;
      }
      *(uint *)&pOrigObj->field_0x14 = uVar6 | 0x20;
    }
  }
  else {
    pObj = (Abc_Obj_t *)0x0;
  }
  return pObj;
}

Assistant:

Abc_Obj_t* Abc_FlowRetime_UpdateBackwardInit_rec( Abc_Obj_t *pOrigObj) {
  Abc_Obj_t *pOrigFanin, *pInitFanin, *pInitObj;
  int i;

  assert(pOrigObj);

  // should never reach primary IOs
  assert(!Abc_ObjIsPi(pOrigObj));
  assert(!Abc_ObjIsPo(pOrigObj));

  // skip bias nodes
  if (FTEST(pOrigObj, BIAS_NODE)) 
    return NULL;

  // does an init node already exist?
  if(!pOrigObj->fMarkA) {

    pInitObj = Abc_FlowRetime_CopyNodeToInitNtk( pOrigObj );

    Abc_FlowRetime_SetInitToOrig( pInitObj, pOrigObj );
    FDATA(pOrigObj)->pInitObj = pInitObj;

    pOrigObj->fMarkA = 1;
  } else {
    pInitObj = FDATA(pOrigObj)->pInitObj;
  }
  assert(pInitObj);
    
  // have we already connected this object?
  if (!pOrigObj->fMarkB) {

    // create and/or connect fanins
    Abc_ObjForEachFanin( pOrigObj, pOrigFanin, i ) {
      // should not reach BOs (i.e. the start of the next frame)
      // the new latch bounday should lie before it
      assert(!Abc_ObjIsBo( pOrigFanin ));
      pInitFanin = Abc_FlowRetime_UpdateBackwardInit_rec( pOrigFanin );
      Abc_ObjAddFanin( pInitObj, pInitFanin );
    }

    pOrigObj->fMarkB = 1;
  }

  return pInitObj;
}